

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O0

void upd7759_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  upd7759_state *chip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset <= *(uint *)((long)info + 0x44)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0x44) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0x44) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 0x50) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void upd7759_write_rom(void* info, UINT32 offset, UINT32 length, const UINT8* data)
{
	upd7759_state *chip = (upd7759_state *)info;
	
	if (offset > chip->romsize)
		return;
	if (offset + length > chip->romsize)
		length = chip->romsize - offset;
	
	memcpy(chip->rombase + offset, data, length);
	
	return;
}